

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::OpenPopupOnItemClick(char *str_id,ImGuiMouseButton mouse_button)

{
  ImGuiWindow *this;
  bool bVar1;
  ImGuiID id;
  
  if (4 < (uint)mouse_button) {
    __assert_fail("button >= 0 && button < ((int)(sizeof(g.IO.MouseDown) / sizeof(*g.IO.MouseDown)))"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                  ,0x1119,"bool ImGui::IsMouseReleased(ImGuiMouseButton)");
  }
  if ((GImGui->IO).MouseReleased[(uint)mouse_button] == true) {
    this = GImGui->CurrentWindow;
    bVar1 = IsItemHovered(8);
    if (bVar1) {
      if (str_id == (char *)0x0) {
        id = (this->DC).LastItemId;
      }
      else {
        id = ImGuiWindow::GetID(this,str_id,(char *)0x0);
      }
      if (id != 0) {
        OpenPopupEx(id);
        return true;
      }
      __assert_fail("id != 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/imgui/imgui.cpp"
                    ,0x1dee,"bool ImGui::OpenPopupOnItemClick(const char *, ImGuiMouseButton)");
    }
  }
  return false;
}

Assistant:

bool ImGui::IsMouseReleased(ImGuiMouseButton button)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(button >= 0 && button < IM_ARRAYSIZE(g.IO.MouseDown));
    return g.IO.MouseReleased[button];
}